

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O2

void __thiscall dg::llvmdg::LLVMSlicer::LLVMSlicer(LLVMSlicer *this)

{
  _Rb_tree_header *p_Var1;
  
  Slicer<dg::LLVMNode>::Slicer(&this->super_Slicer<dg::LLVMNode>,0);
  (this->super_Slicer<dg::LLVMNode>)._vptr_Slicer = (_func_int **)&PTR_removeNode_00146b28;
  p_Var1 = &(this->dont_touch)._M_t._M_impl.super__Rb_tree_header;
  (this->dont_touch)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dont_touch)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dont_touch)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dont_touch)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dont_touch)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

LLVMSlicer() = default;